

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O0

Token __thiscall avro::json::JsonParser::doAdvance(JsonParser *this)

{
  int iVar1;
  reference pvVar2;
  undefined8 uVar3;
  long in_RDI;
  Token in_stack_0000002c;
  size_t in_stack_00000030;
  char *in_stack_00000038;
  JsonParser *in_stack_00000040;
  char ch;
  uchar in_stack_00000177;
  JsonParser *in_stack_00000178;
  char in_stack_00000187;
  JsonParser *in_stack_00000188;
  value_type *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  JsonParser *in_stack_ffffffffffffffb0;
  JsonParser *in_stack_ffffffffffffffe0;
  char local_11;
  Token local_4;
  
  local_11 = next(in_stack_ffffffffffffffb0);
  if (local_11 == ']') {
    pvVar2 = std::
             stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
             ::top((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
                    *)0x203997);
    *(value_type *)(in_RDI + 0x50) = *pvVar2;
    std::
    stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
    ::pop((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
           *)0x2039a6);
    local_4 = tkArrayEnd;
  }
  else if (local_11 == '}') {
    pvVar2 = std::
             stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
             ::top((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
                    *)0x203a39);
    *(value_type *)(in_RDI + 0x50) = *pvVar2;
    std::
    stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
    ::pop((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
           *)0x203a48);
    local_4 = tkObjectEnd;
  }
  else {
    if (local_11 == ',') {
      if ((*(int *)(in_RDI + 0x50) != 4) && (*(int *)(in_RDI + 0x50) != 2)) {
        uVar3 = __cxa_allocate_exception(0x18);
        unexpected(in_stack_00000178,in_stack_00000177);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      if (*(int *)(in_RDI + 0x50) == 4) {
        *(undefined4 *)(in_RDI + 0x50) = 3;
      }
      local_11 = next(in_stack_ffffffffffffffb0);
    }
    else if (local_11 == ':') {
      if (*(int *)(in_RDI + 0x50) != 5) {
        uVar3 = __cxa_allocate_exception(0x18);
        unexpected(in_stack_00000178,in_stack_00000177);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      *(undefined4 *)(in_RDI + 0x50) = 4;
      local_11 = next(in_stack_ffffffffffffffb0);
    }
    if (*(int *)(in_RDI + 0x50) == 3) {
      if (local_11 != '\"') {
        uVar3 = __cxa_allocate_exception(0x18);
        unexpected(in_stack_00000178,in_stack_00000177);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      *(undefined4 *)(in_RDI + 0x50) = 5;
    }
    else if (*(int *)(in_RDI + 0x50) == 1) {
      *(undefined4 *)(in_RDI + 0x50) = 2;
    }
    if (local_11 == '\"') {
      local_4 = tryString(in_stack_ffffffffffffffe0);
    }
    else if (local_11 == '[') {
      std::
      stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
      ::push((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
              *)CONCAT44(0x5b,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      *(undefined4 *)(in_RDI + 0x50) = 1;
      local_4 = tkArrayStart;
    }
    else if (local_11 == 'f') {
      *(undefined1 *)(in_RDI + 0x74) = 0;
      local_4 = tryLiteral(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    }
    else if (local_11 == 'n') {
      local_4 = tryLiteral(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    }
    else if (local_11 == 't') {
      *(undefined1 *)(in_RDI + 0x74) = 1;
      local_4 = tryLiteral(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_0000002c);
    }
    else if (local_11 == '{') {
      std::
      stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
      ::push((stack<avro::json::JsonParser::State,_std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>_>
              *)CONCAT44(0x7b,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      *(undefined4 *)(in_RDI + 0x50) = 3;
      local_4 = tkObjectStart;
    }
    else {
      iVar1 = isdigit((int)local_11);
      if ((iVar1 == 0) && (local_11 != '-')) {
        uVar3 = __cxa_allocate_exception(0x18);
        unexpected(in_stack_00000178,in_stack_00000177);
        __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
      }
      local_4 = tryNumber(in_stack_00000188,in_stack_00000187);
    }
  }
  return local_4;
}

Assistant:

JsonParser::Token JsonParser::doAdvance()
{
    char ch = next();
    if (ch == ']') {
        if (curState == stArray0 || stArrayN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkArrayEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == '}') {
        if (curState == stObject0 || stObjectN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkObjectEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == ',') {
        if (curState != stObjectN && curState != stArrayN) {
            throw unexpected(ch);
        }
        if (curState == stObjectN) {
            curState = stObject0;
        }
        ch = next();
    } else if (ch == ':') {
        if (curState != stKey) {
            throw unexpected(ch);
        }
        curState = stObjectN;
        ch = next();
    }

    if (curState == stObject0) {
        if (ch != '"') {
            throw unexpected(ch);
        }
        curState = stKey;
    } else if (curState == stArray0) {
        curState = stArrayN;
    }

    switch (ch) {
    case '[':
        stateStack.push(curState);
        curState = stArray0;
        return tkArrayStart;
    case '{':
        stateStack.push(curState);
        curState = stObject0;
        return tkObjectStart;
    case '"':
        return tryString();
    case 't':
        bv = true;
        return tryLiteral("rue", 3, tkBool);
    case 'f':
        bv = false;
        return tryLiteral("alse", 4, tkBool);
    case 'n':
        return tryLiteral("ull", 3, tkNull);
    default:
        if (isdigit(ch) || ch == '-') {
            return tryNumber(ch);
        } else {
            throw unexpected(ch);
        }
    }
}